

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch_s.c
# Opt level: O0

void * bsearch_s(void *key,void *base,rsize_t nmemb,rsize_t size,
                _func_int_void_ptr_void_ptr_void_ptr *compar,void *context)

{
  int iVar1;
  ulong uVar2;
  size_t corr;
  int rc;
  void *pivot;
  void *context_local;
  _func_int_void_ptr_void_ptr_void_ptr *compar_local;
  rsize_t size_local;
  rsize_t nmemb_local;
  void *base_local;
  void *key_local;
  
  if (((nmemb < 0x8000000000000000) && (size < 0x8000000000000000)) &&
     ((size_local = nmemb, nmemb_local = (rsize_t)base, nmemb == 0 ||
      (((key != (void *)0x0 && (base != (void *)0x0)) &&
       (compar != (_func_int_void_ptr_void_ptr_void_ptr *)0x0)))))) {
    do {
      while( true ) {
        if (size_local == 0) {
          return (void *)0x0;
        }
        uVar2 = size_local & 1;
        size_local = size_local >> 1;
        key_local = (void *)(nmemb_local + size_local * size);
        iVar1 = (*compar)(key,key_local,context);
        if (iVar1 < 1) break;
        nmemb_local = (long)key_local + size;
        size_local = size_local - (1 - uVar2);
      }
    } while (iVar1 != 0);
  }
  else {
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    key_local = (void *)0x0;
  }
  return key_local;
}

Assistant:

void * bsearch_s( const void * key, const void * base, rsize_t nmemb, rsize_t size, int ( *compar )( const void *, const void *, void * ), void * context )
{
    const void * pivot;
    int rc;
    size_t corr;

    if ( nmemb > RSIZE_MAX || size > RSIZE_MAX || ( nmemb > 0 && ( key == NULL || base == NULL || compar == NULL ) ) )
    {
        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return NULL;
    }

    while ( nmemb )
    {
        /* algorithm needs -1 correction if remaining elements are an even number. */
        corr = nmemb % 2;
        nmemb /= 2;
        pivot = ( const char * )base + ( nmemb * size );
        rc = compar( key, pivot, context );

        if ( rc > 0 )
        {
            base = ( const char * )pivot + size;
            /* applying correction */
            nmemb -= ( 1 - corr );
        }
        else if ( rc == 0 )
        {
            return ( void * )pivot;
        }
    }

    return NULL;
}